

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O3

void __thiscall QColorDialogPrivate::newColorTypedIn(QColorDialogPrivate *this,QRgb rgb)

{
  QColorLuminancePicker *this_00;
  long in_FS_OFFSET;
  int v;
  int s;
  int h;
  int local_4c;
  int local_48;
  int local_44 [2];
  undefined2 local_3c;
  undefined6 local_3a;
  undefined2 uStack_34;
  undefined2 uStack_32;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->super_QDialogPrivate).nativeDialogInUse == false) {
    local_44[0] = -0x55555556;
    local_48 = -0x55555556;
    local_4c = -0x55555556;
    uStack_32 = 0xaaaa;
    local_44[1] = 0;
    local_3c = 0xffff;
    local_3a = 0;
    uStack_34 = 0;
    QColor::setRgb((uint)(local_44 + 1));
    QColor::getHsv(local_44 + 1,local_44,&local_48,&local_4c);
    QtPrivate::QColorPicker::setCol(this->cp,local_44[0],local_48);
    this_00 = this->lp;
    this_00->val = local_4c;
    this_00->hue = local_44[0];
    this_00->sat = local_48;
    if (this_00->pix != (QPixmap *)0x0) {
      (**(code **)(*(long *)this_00->pix + 8))();
    }
    this_00->pix = (QPixmap *)0x0;
    QWidget::repaint(&this_00->super_QWidget);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::newColorTypedIn(QRgb rgb)
{
    if (!nativeDialogInUse) {
        int h, s, v;
        rgb2hsv(rgb, h, s, v);
        cp->setCol(h, s);
        lp->setCol(h, s, v);
    }
}